

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Atmosphere A;
  allocator<char> local_a9;
  double local_a8;
  double local_a0;
  double local_98;
  Atmosphere local_90;
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[1],&local_a9);
    local_98 = std::__cxx11::stod((string *)&local_90,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[2],&local_a9);
    local_a0 = std::__cxx11::stod((string *)&local_90,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[3],&local_a9);
    local_a8 = std::__cxx11::stod((string *)&local_90,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    local_a8 = 100.0;
    local_a0 = 80000.0;
    local_98 = 0.0;
  }
  Atmosphere::Atmosphere(&local_90);
  Atmosphere::print_tabular(&local_90,local_98,local_a0,local_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nPress Enter to Exit");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::ignore();
  Atmosphere::~Atmosphere(&local_90);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    double hmin, hmax, hstep;

    if (argc == 4) {
        hmin = std::stod(argv[1]);
        hmax = std::stod(argv[2]);
        hstep = std::stod(argv[3]);
    } else {
        hmin = 0;
        hmax = 80000.0;
        hstep = 100.0;
    }

    Atmosphere A = Atmosphere();
    A.print_tabular(hmin, hmax, hstep);

    // Just to keep console window open
    std::cout << "\nPress Enter to Exit" << std::endl;
    std::cin.ignore();

    return 0;
}